

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmakecl.cpp
# Opt level: O0

void __thiscall
CTcLibParserCmdline::CTcLibParserCmdline
          (CTcLibParserCmdline *this,CTcHostIfc *hostifc,CTcMake *mk,CRcResList *res_list,
          char *lib_name,char *lib_url)

{
  char *pcVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  char *in_RDI;
  char *in_stack_00000fb8;
  CTcLibParser *in_stack_00000fc0;
  
  CTcLibParser::CTcLibParser(in_stack_00000fc0,in_stack_00000fb8);
  *(undefined ***)in_RDI = &PTR__CTcLibParserCmdline_003ca9e0;
  *(undefined8 *)(in_RDI + 0x38) = in_RSI;
  *(undefined8 *)(in_RDI + 0x28) = in_RDX;
  *(undefined8 *)(in_RDI + 0x30) = in_RCX;
  pcVar1 = lib_copy_str(in_RDI);
  *(char **)(in_RDI + 0x40) = pcVar1;
  pcVar1 = lib_copy_str(in_RDI);
  *(char **)(in_RDI + 0x48) = pcVar1;
  in_RDI[0x50] = '\0';
  in_RDI[0x51] = '\0';
  in_RDI[0x52] = '\0';
  in_RDI[0x53] = '\0';
  return;
}

Assistant:

CTcLibParserCmdline(CTcHostIfc *hostifc, CTcMake *mk,
                        CRcResList *res_list,
                        const char *lib_name, const char *lib_url)
        : CTcLibParser(lib_name)
    {
        /* remember our host interface */
        hostifc_ = hostifc;

        /* remember our 'make' control object */
        mk_ = mk;

        /* remember our resource list container */
        res_list_ = res_list;

        /* remember the URL to the library */
        lib_name_ = lib_copy_str(lib_name);
        lib_url_ = lib_copy_str(lib_url);

        /* no "nodef" flag yet */
        nodef_ = FALSE;
    }